

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

string * __thiscall
pbrt::RealisticCamera::LensElementInterface::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LensElementInterface *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ LensElementInterface curvatureRadius: %f thickness: %f eta: %f apertureRadius: %f ]"
             ,&this->curvatureRadius,&this->thickness,&this->eta,&this->apertureRadius);
  return __return_storage_ptr__;
}

Assistant:

std::string RealisticCamera::LensElementInterface::ToString() const {
    return StringPrintf("[ LensElementInterface curvatureRadius: %f thickness: %f "
                        "eta: %f apertureRadius: %f ]",
                        curvatureRadius, thickness, eta, apertureRadius);
}